

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softmax.cpp
# Opt level: O3

int __thiscall ncnn::Softmax::forward_inplace(Softmax *this,Mat *bottom_top_blob,Option *opt)

{
  uint stride;
  uint size;
  uint size_00;
  int stride_00;
  int i;
  int iVar1;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  float *pfVar9;
  long lVar10;
  ulong uVar12;
  bool bVar13;
  bool bVar14;
  bool local_61;
  ulong local_60;
  ulong uVar11;
  
  uVar2 = bottom_top_blob->dims;
  stride = bottom_top_blob->w;
  uVar11 = (ulong)stride;
  uVar8 = bottom_top_blob->h;
  uVar12 = (ulong)uVar8;
  size = bottom_top_blob->d;
  size_00 = bottom_top_blob->c;
  uVar6 = (ulong)size_00;
  iVar1 = (this->axis >> 0x1f & uVar2) + this->axis;
  if (uVar2 == 1) {
    softmax((float *)bottom_top_blob->data,stride);
    bVar13 = iVar1 == 0;
LAB_0033b927:
    bVar14 = false;
  }
  else {
    bVar13 = iVar1 == 0;
    bVar14 = uVar2 == 2;
    if ((bVar14) && (iVar1 == 0)) {
      if ((int)stride < 1) {
        bVar13 = true;
        goto LAB_0033b927;
      }
      lVar10 = 0;
      do {
        softmax((float *)((long)bottom_top_blob->data + lVar10),uVar8,stride);
        lVar10 = lVar10 + 4;
      } while (uVar11 * 4 - lVar10 != 0);
      bVar13 = true;
      bVar14 = true;
    }
    if ((bool)(bVar14 & iVar1 == 1 & 0 < (int)uVar8)) {
      uVar3 = 0;
      do {
        softmax((float *)((long)bottom_top_blob->w * uVar3 * bottom_top_blob->elemsize +
                         (long)bottom_top_blob->data),stride);
        uVar3 = uVar3 + 1;
      } while (uVar12 != uVar3);
    }
    bVar14 = uVar2 == 3;
    if (((bool)(bVar14 & bVar13)) && (0 < (int)(uVar8 * stride))) {
      lVar10 = 0;
      do {
        softmax((float *)((long)bottom_top_blob->data + lVar10),size_00,(int)bottom_top_blob->cstep)
        ;
        lVar10 = lVar10 + 4;
      } while ((ulong)(uVar8 * stride) << 2 != lVar10);
    }
  }
  local_61 = 0 < (int)uVar8;
  if ((bool)(0 < (int)size_00 & bVar14 & iVar1 == 1)) {
    uVar3 = 0;
    do {
      if (0 < (int)stride) {
        pfVar9 = (float *)(bottom_top_blob->cstep * uVar3 * bottom_top_blob->elemsize +
                          (long)bottom_top_blob->data);
        uVar5 = uVar11;
        do {
          softmax(pfVar9,uVar8,stride);
          pfVar9 = pfVar9 + 1;
          uVar7 = (int)uVar5 - 1;
          uVar5 = (ulong)uVar7;
        } while (uVar7 != 0);
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 != uVar6);
  }
  if ((bool)(bVar14 & iVar1 == 2 & 0 < (int)size_00)) {
    local_60 = 0;
    do {
      if (local_61) {
        pfVar9 = (float *)(bottom_top_blob->cstep * bottom_top_blob->elemsize * local_60 +
                          (long)bottom_top_blob->data);
        uVar3 = uVar12;
        do {
          softmax(pfVar9,stride);
          pfVar9 = pfVar9 + (int)stride;
          uVar7 = (int)uVar3 - 1;
          uVar3 = (ulong)uVar7;
        } while (uVar7 != 0);
      }
      local_60 = local_60 + 1;
    } while (local_60 != uVar6);
  }
  if (((bool)(uVar2 == 4 & bVar13)) && (uVar7 = uVar8 * stride * size, 0 < (int)uVar7)) {
    lVar10 = 0;
    do {
      softmax((float *)((long)bottom_top_blob->data + lVar10),size_00,(int)bottom_top_blob->cstep);
      lVar10 = lVar10 + 4;
    } while ((ulong)uVar7 << 2 != lVar10);
  }
  if ((uVar2 == 4 && iVar1 == 1) && 0 < (int)size_00) {
    stride_00 = uVar8 * stride;
    local_60 = 0;
    do {
      if (0 < stride_00) {
        pfVar9 = (float *)(bottom_top_blob->cstep * local_60 * bottom_top_blob->elemsize +
                          (long)bottom_top_blob->data);
        iVar4 = stride_00;
        do {
          softmax(pfVar9,size,stride_00);
          pfVar9 = pfVar9 + 1;
          iVar4 = iVar4 + -1;
        } while (iVar4 != 0);
      }
      local_60 = local_60 + 1;
    } while (local_60 != uVar6);
  }
  if ((iVar1 == 2 && (uVar2 ^ 4) == 0) && 0 < (int)size_00) {
    local_60 = 0;
    do {
      if (0 < (int)size) {
        uVar3 = 0;
        do {
          if (0 < (int)stride) {
            pfVar9 = (float *)((long)bottom_top_blob->data +
                              (long)bottom_top_blob->h * bottom_top_blob->elemsize *
                              (long)bottom_top_blob->w * uVar3 +
                              bottom_top_blob->cstep * local_60 * bottom_top_blob->elemsize);
            uVar5 = uVar11;
            do {
              softmax(pfVar9,uVar8,stride);
              pfVar9 = pfVar9 + 1;
              uVar7 = (int)uVar5 - 1;
              uVar5 = (ulong)uVar7;
            } while (uVar7 != 0);
          }
          uVar3 = uVar3 + 1;
        } while (uVar3 != size);
      }
      local_60 = local_60 + 1;
    } while (local_60 != uVar6);
  }
  if (((uVar2 ^ 4) == 0 && iVar1 == 3) && 0 < (int)size_00) {
    local_60 = 0;
    do {
      if (0 < (int)size) {
        pfVar9 = (float *)(bottom_top_blob->cstep * local_60 * bottom_top_blob->elemsize +
                          (long)bottom_top_blob->data);
        uVar2 = 0;
        do {
          uVar11 = uVar12;
          if (local_61) {
            do {
              softmax(pfVar9,stride);
              pfVar9 = pfVar9 + (int)stride;
              uVar8 = (int)uVar11 - 1;
              uVar11 = (ulong)uVar8;
            } while (uVar8 != 0);
          }
          uVar2 = uVar2 + 1;
        } while (uVar2 != size);
      }
      local_60 = local_60 + 1;
    } while (local_60 != uVar6);
  }
  return 0;
}

Assistant:

int Softmax::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    // value = expf( value - global max value )
    // sum all value
    // value = value / sum

    const int dims = bottom_top_blob.dims;
    const int w = bottom_top_blob.w;
    const int h = bottom_top_blob.h;
    const int d = bottom_top_blob.d;
    const int channels = bottom_top_blob.c;
    const int positive_axis = axis < 0 ? dims + axis : axis;

    if (dims == 1) // positive_axis == 0
    {
        float* ptr = bottom_top_blob;

        softmax(ptr, w);
    }

    if (dims == 2 && positive_axis == 0)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < w; i++)
        {
            float* ptr = (float*)bottom_top_blob + i;

            softmax(ptr, h, w);
        }
    }

    if (dims == 2 && positive_axis == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);

            softmax(ptr, w);
        }
    }

    if (dims == 3 && positive_axis == 0)
    {
        const int size = w * h;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < size; i++)
        {
            float* ptr = (float*)bottom_top_blob + i;

            softmax(ptr, channels, bottom_top_blob.cstep);
        }
    }

    if (dims == 3 && positive_axis == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < w; i++)
            {
                softmax(ptr, h, w);
                ptr += 1;
            }
        }
    }

    if (dims == 3 && positive_axis == 2)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < h; i++)
            {
                softmax(ptr, w);
                ptr += w;
            }
        }
    }

    if (dims == 4 && positive_axis == 0)
    {
        const int size = w * h * d;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < size; i++)
        {
            float* ptr = (float*)bottom_top_blob + i;

            softmax(ptr, channels, bottom_top_blob.cstep);
        }
    }

    if (dims == 4 && positive_axis == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < w * h; i++)
            {
                softmax(ptr, d, w * h);
                ptr += 1;
            }
        }
    }

    if (dims == 4 && positive_axis == 2)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            for (int i = 0; i < d; i++)
            {
                float* ptr = bottom_top_blob.channel(q).depth(i);

                for (int j = 0; j < w; j++)
                {
                    softmax(ptr, h, w);
                    ptr += 1;
                }
            }
        }
    }

    if (dims == 4 && positive_axis == 3)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < d; i++)
            {
                for (int j = 0; j < h; j++)
                {
                    softmax(ptr, w);
                    ptr += w;
                }
            }
        }
    }

    return 0;
}